

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression_config.cpp
# Opt level: O0

vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> * __thiscall
duckdb::DBConfig::GetCompressionFunctions(DBConfig *this,PhysicalType physical_type)

{
  undefined1 in_DL;
  DBConfig *in_RSI;
  vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *in_RDI;
  vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *result;
  PhysicalType in_stack_ffffffffffffffe6;
  CompressionType in_stack_ffffffffffffffe7;
  undefined6 in_stack_ffffffffffffffe8;
  undefined1 uVar1;
  
  uVar1 = 0;
  vector<std::reference_wrapper<duckdb::CompressionFunction>,_true>::vector
            ((vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)0x26add5);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  TryLoadCompression(in_RSI,(vector<std::reference_wrapper<duckdb::CompressionFunction>,_true> *)
                            CONCAT17(in_DL,CONCAT16(uVar1,in_stack_ffffffffffffffe8)),
                     in_stack_ffffffffffffffe7,in_stack_ffffffffffffffe6);
  return in_RDI;
}

Assistant:

vector<reference<CompressionFunction>> DBConfig::GetCompressionFunctions(const PhysicalType physical_type) {
	vector<reference<CompressionFunction>> result;
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_UNCOMPRESSED, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_RLE, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_BITPACKING, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_DICTIONARY, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_CHIMP, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_PATAS, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ALP, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ALPRD, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_FSST, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ZSTD, physical_type);
	TryLoadCompression(*this, result, CompressionType::COMPRESSION_ROARING, physical_type);
	return result;
}